

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_55(QPDF *pdf,char *arg2)

{
  bool bVar1;
  QPDFWriter local_f8 [8];
  QPDFWriter w;
  allocator<char> local_e1;
  string local_e0 [32];
  QPDFObjectHandle local_c0;
  QPDFObjectHandle local_b0;
  QPDFObjectHandle local_a0;
  reference local_90;
  QPDFPageObjectHelper *ph;
  iterator __end1;
  iterator __begin1;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *__range1;
  QPDFObjectHandle qtest;
  QPDFPageDocumentHelper local_50;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_30 [8];
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_50,pdf);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_50);
  QPDFObjectHandle::newArray();
  __end1 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::begin(local_30)
  ;
  ph = (QPDFPageObjectHelper *)
       std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::end(local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
                                *)&ph);
    if (!bVar1) break;
    local_90 = __gnu_cxx::
               __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
               ::operator*(&__end1);
    QPDFPageObjectHelper::getFormXObjectForPage(SUB81(&local_a0,0));
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)&__range1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
    QPDFPageObjectHelper::getFormXObjectForPage(SUB81(&local_b0,0));
    QPDFObjectHandle::appendItem((QPDFObjectHandle *)&__range1);
    QPDFObjectHandle::~QPDFObjectHandle(&local_b0);
    __gnu_cxx::
    __normal_iterator<QPDFPageObjectHelper_*,_std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>_>
    ::operator++(&__end1);
  }
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"/QTest",&local_e1);
  QPDFObjectHandle::replaceKey((string *)&local_c0,(QPDFObjectHandle *)local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  QPDFObjectHandle::~QPDFObjectHandle(&local_c0);
  QPDFWriter::QPDFWriter(local_f8,pdf,"a.pdf");
  QPDFWriter::setQDFMode(SUB81(local_f8,0));
  QPDFWriter::setStaticID(SUB81(local_f8,0));
  QPDFWriter::write();
  QPDFWriter::~QPDFWriter(local_f8);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range1);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_30);
  return;
}

Assistant:

static void
test_55(QPDF& pdf, char const* arg2)
{
    // Form XObjects
    std::vector<QPDFPageObjectHelper> pages = QPDFPageDocumentHelper(pdf).getAllPages();
    QPDFObjectHandle qtest = QPDFObjectHandle::newArray();
    for (auto& ph: pages) {
        qtest.appendItem(ph.getFormXObjectForPage());
        qtest.appendItem(ph.getFormXObjectForPage(false));
    }
    pdf.getTrailer().replaceKey("/QTest", qtest);
    QPDFWriter w(pdf, "a.pdf");
    w.setQDFMode(true);
    w.setStaticID(true);
    w.write();
}